

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

Vector<double,_4> *
tcu::mix<4>(Vector<double,_4> *__return_storage_ptr__,Vector<double,_4> *x,Vector<double,_4> *y,
           double a)

{
  int i;
  long lVar1;
  
  Vector<double,_4>::Vector(__return_storage_ptr__);
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    __return_storage_ptr__->m_data[lVar1] = x->m_data[lVar1] * (1.0 - a) + y->m_data[lVar1] * a;
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<double, Size> mix (const Vector<double, Size>& x, const Vector<double, Size>& y, double a)
{
	Vector<double, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = deMix(x.m_data[i], y.m_data[i], a);
	return res;
}